

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset_props.cpp
# Opt level: O3

UnicodeSet * __thiscall
icu_63::UnicodeSet::applyPropertyPattern
          (UnicodeSet *this,UnicodeString *pattern,ParsePosition *ppos,UErrorCode *ec)

{
  short sVar1;
  _func_int *p_Var2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  char16_t *pcVar8;
  char16_t *pcVar9;
  char16_t cVar10;
  undefined4 uVar11;
  undefined8 unaff_R13;
  UnicodeString propName;
  UnicodeString valueName;
  uint local_100;
  undefined4 local_fc;
  int local_f8;
  undefined4 local_f4;
  UnicodeString local_f0;
  UnicodeString local_b0;
  UnicodeString local_70;
  
  if (U_ZERO_ERROR < *ec) {
    return this;
  }
  local_100 = ppos->index;
  sVar1 = (pattern->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    uVar3 = *(uint *)((long)&pattern->fUnion + 4);
  }
  else {
    uVar3 = (int)sVar1 >> 5;
  }
  uVar5 = (ulong)uVar3;
  if (((int)uVar3 < (int)(local_100 + 5)) || (uVar3 <= local_100)) goto LAB_002dcabf;
  pcVar9 = (char16_t *)((long)&pattern->fUnion + 2);
  pcVar8 = pcVar9;
  if (((int)sVar1 & 2U) == 0) {
    pcVar8 = (pattern->fUnion).fFields.fArray;
  }
  if (pcVar8[(int)local_100] == L'\\') {
    if ((uVar3 <= local_100 + 1) ||
       (cVar10 = pcVar8[(long)(int)local_100 + 1], (cVar10 & 0xffdfU) != 0x50)) {
      if (uVar3 <= local_100 + 1) goto LAB_002dcabf;
      uVar5 = (ulong)(int)(local_100 + 1);
      cVar10 = L'N';
      if (pcVar8[uVar5] != L'N') goto LAB_002dcabf;
    }
    uVar11 = (undefined4)CONCAT71((int7)((ulong)unaff_R13 >> 8),cVar10 == L'P');
    local_fc = (undefined4)CONCAT71((int7)(uVar5 >> 8),cVar10 == L'N');
    local_100 = local_100 + 2;
    uVar3 = ICU_Utility::skipWhitespace(pattern,(int32_t *)&local_100,'\0');
    sVar1 = (pattern->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      uVar4 = (pattern->fUnion).fFields.fLength;
    }
    else {
      uVar4 = (int)sVar1 >> 5;
    }
    if ((uVar3 == uVar4) || (local_100 = uVar3 + 1, uVar4 <= uVar3)) goto LAB_002dcabf;
    if (((int)sVar1 & 2U) == 0) {
      pcVar9 = (pattern->fUnion).fFields.fArray;
    }
    if (pcVar9[(int)uVar3] != L'{') goto LAB_002dcabf;
    uVar7 = local_100;
    if ((int)uVar4 < (int)local_100) {
      uVar7 = uVar4;
    }
    uVar6 = 0;
    if (-2 < (int)uVar3) {
      uVar6 = uVar7;
    }
    uVar3 = UnicodeString::doIndexOf(pattern,L'}',uVar6,uVar4 - uVar6);
    local_f8 = 1;
  }
  else {
    if (((pcVar8[(int)local_100] != L'[') || (uVar3 <= local_100 + 1)) ||
       (pcVar8[(long)(int)local_100 + 1] != L':')) goto LAB_002dcabf;
    local_100 = local_100 + 2;
    local_100 = ICU_Utility::skipWhitespace(pattern,(int32_t *)&local_100,'\0');
    sVar1 = (pattern->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      uVar3 = (pattern->fUnion).fFields.fLength;
    }
    else {
      uVar3 = (int)sVar1 >> 5;
    }
    if (local_100 < uVar3 && (int)local_100 < (int)uVar3) {
      if (((int)sVar1 & 2U) == 0) {
        pcVar9 = (pattern->fUnion).fFields.fArray;
      }
      if (pcVar9[(int)local_100] != L'^') goto LAB_002dca4f;
      local_100 = local_100 + 1;
      uVar11 = (undefined4)CONCAT71((int7)((ulong)&local_100 >> 8),1);
    }
    else {
LAB_002dca4f:
      uVar11 = 0;
    }
    uVar4 = local_100;
    if ((int)uVar3 < (int)local_100) {
      uVar4 = uVar3;
    }
    local_fc = 0;
    if ((int)local_100 < 0) {
      uVar4 = 0;
    }
    local_f8 = 2;
    uVar3 = UnicodeString::indexOf(pattern,L":]",0,2,uVar4,uVar3 - uVar4);
  }
  if (-1 < (int)uVar3) {
    sVar1 = (pattern->fUnion).fStackFields.fLengthAndFlags;
    if ((int)local_100 < 0) {
      uVar4 = (pattern->fUnion).fFields.fLength;
      uVar7 = 0;
    }
    else {
      uVar4 = (pattern->fUnion).fFields.fLength;
      uVar7 = (int)sVar1 >> 5;
      if (sVar1 < 0) {
        uVar7 = uVar4;
      }
      if ((int)local_100 <= (int)uVar7) {
        uVar7 = local_100;
      }
    }
    uVar6 = (int)sVar1 >> 5;
    if (sVar1 < 0) {
      uVar6 = uVar4;
    }
    local_f4 = uVar11;
    uVar4 = UnicodeString::doIndexOf(pattern,L'=',uVar7,uVar6 - uVar7);
    local_f0.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003e5ab8;
    local_f0.fUnion.fStackFields.fLengthAndFlags = 2;
    local_b0.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003e5ab8;
    local_b0.fUnion.fStackFields.fLengthAndFlags = 2;
    p_Var2 = (pattern->super_Replaceable).super_UObject._vptr_UObject[3];
    if (uVar4 < uVar3 && (char)local_fc == '\0') {
      (*p_Var2)(pattern,(ulong)local_100,(ulong)uVar4,&local_f0);
      (*(pattern->super_Replaceable).super_UObject._vptr_UObject[3])
                (pattern,(ulong)(uVar4 + 1),(ulong)uVar3,&local_b0);
    }
    else {
      (*p_Var2)(pattern,(ulong)local_100,(ulong)uVar3);
      if ((char)local_fc != '\0') {
        UnicodeString::operator=(&local_b0,&local_f0);
        UnicodeString::UnicodeString(&local_70,"na",2,kInvariant);
        UnicodeString::moveFrom(&local_f0,&local_70);
        UnicodeString::~UnicodeString(&local_70);
      }
    }
    applyPropertyAlias(this,&local_f0,&local_b0,ec);
    if (*ec < U_ILLEGAL_ARGUMENT_ERROR) {
      if ((char)local_f4 != '\0') {
        complement(this);
      }
      ppos->index = uVar3 + local_f8;
    }
    UnicodeString::~UnicodeString(&local_b0);
    UnicodeString::~UnicodeString(&local_f0);
    return this;
  }
LAB_002dcabf:
  *ec = U_ILLEGAL_ARGUMENT_ERROR;
  return this;
}

Assistant:

UnicodeSet& UnicodeSet::applyPropertyPattern(const UnicodeString& pattern,
                                             ParsePosition& ppos,
                                             UErrorCode &ec) {
    int32_t pos = ppos.getIndex();

    UBool posix = FALSE; // true for [:pat:], false for \p{pat} \P{pat} \N{pat}
    UBool isName = FALSE; // true for \N{pat}, o/w false
    UBool invert = FALSE;

    if (U_FAILURE(ec)) return *this;

    // Minimum length is 5 characters, e.g. \p{L}
    if ((pos+5) > pattern.length()) {
        FAIL(ec);
    }

    // On entry, ppos should point to one of the following locations:
    // Look for an opening [:, [:^, \p, or \P
    if (isPOSIXOpen(pattern, pos)) {
        posix = TRUE;
        pos += 2;
        pos = ICU_Utility::skipWhitespace(pattern, pos);
        if (pos < pattern.length() && pattern.charAt(pos) == COMPLEMENT) {
            ++pos;
            invert = TRUE;
        }
    } else if (isPerlOpen(pattern, pos) || isNameOpen(pattern, pos)) {
        UChar c = pattern.charAt(pos+1);
        invert = (c == UPPER_P);
        isName = (c == UPPER_N);
        pos += 2;
        pos = ICU_Utility::skipWhitespace(pattern, pos);
        if (pos == pattern.length() || pattern.charAt(pos++) != OPEN_BRACE) {
            // Syntax error; "\p" or "\P" not followed by "{"
            FAIL(ec);
        }
    } else {
        // Open delimiter not seen
        FAIL(ec);
    }

    // Look for the matching close delimiter, either :] or }
    int32_t close;
    if (posix) {
      close = pattern.indexOf(POSIX_CLOSE, 2, pos);
    } else {
      close = pattern.indexOf(CLOSE_BRACE, pos);
    }
    if (close < 0) {
        // Syntax error; close delimiter missing
        FAIL(ec);
    }

    // Look for an '=' sign.  If this is present, we will parse a
    // medium \p{gc=Cf} or long \p{GeneralCategory=Format}
    // pattern.
    int32_t equals = pattern.indexOf(EQUALS, pos);
    UnicodeString propName, valueName;
    if (equals >= 0 && equals < close && !isName) {
        // Equals seen; parse medium/long pattern
        pattern.extractBetween(pos, equals, propName);
        pattern.extractBetween(equals+1, close, valueName);
    }

    else {
        // Handle case where no '=' is seen, and \N{}
        pattern.extractBetween(pos, close, propName);
            
        // Handle \N{name}
        if (isName) {
            // This is a little inefficient since it means we have to
            // parse NAME_PROP back to UCHAR_NAME even though we already
            // know it's UCHAR_NAME.  If we refactor the API to
            // support args of (UProperty, char*) then we can remove
            // NAME_PROP and make this a little more efficient.
            valueName = propName;
            propName = UnicodeString(NAME_PROP, NAME_PROP_LENGTH, US_INV);
        }
    }

    applyPropertyAlias(propName, valueName, ec);

    if (U_SUCCESS(ec)) {
        if (invert) {
            complement();
        }
            
        // Move to the limit position after the close delimiter if the
        // parse succeeded.
        ppos.setIndex(close + (posix ? 2 : 1));
    }

    return *this;
}